

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

BOOL __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::ProtectPages
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,char *address,size_t pageCount,
          void *segmentParam,DWORD dwVirtualProtectFlags,DWORD desiredOldProtectFlag)

{
  undefined4 *puVar1;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  char *pcVar6;
  long lVar7;
  HANDLE pVVar8;
  SIZE_T SVar9;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pageSegment;
  ulong dwSize;
  undefined8 *in_FS_OFFSET;
  undefined1 local_70 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  DWORD oldProtect;
  
  pcVar6 = *(char **)((long)segmentParam + 0x10);
  if (address < pcVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa3f,"(address >= segment->GetAddress())",
                       "address >= segment->GetAddress()");
    if (!bVar4) goto LAB_00256fdc;
    *puVar1 = 0;
    pcVar6 = *(char **)((long)segmentParam + 0x10);
  }
  lVar7 = *(long *)((long)segmentParam + 0x18);
  if ((lVar7 - pageCount) * 0x1000 < (ulong)(uint)((int)address - (int)pcVar6)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa40,
                       "(((uint)(((char *)address) - segment->GetAddress()) <= (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize))"
                       ,
                       "((uint)(((char *)address) - segment->GetAddress()) <= (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize)"
                      );
    if (!bVar4) goto LAB_00256fdc;
    *puVar1 = 0;
    lVar7 = *(long *)((long)segmentParam + 0x18);
  }
  if (lVar7 - (ulong)*(uint *)((long)segmentParam + 0x28) <=
      (ulong)(this->
             super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             ).maxAllocPageCount) {
    if (pageCount >> 0x20 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa45,"(pageCount <= ((uint32_t)~((uint32_t)0)))",
                         "PageSegment should always be smaller than 4G pages");
      if (!bVar4) goto LAB_00256fdc;
      *puVar1 = 0;
    }
    bVar4 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted
                      ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,address,
                       (uint)pageCount);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa46,
                         "(!pageSegment->IsFreeOrDecommitted(address, static_cast<uint>(pageCount)))"
                         ,"!pageSegment->IsFreeOrDecommitted(address, static_cast<uint>(pageCount))"
                        );
      if (!bVar4) goto LAB_00256fdc;
      *puVar1 = 0;
    }
  }
  if (((((ulong)address & 0xfff) == 0) && (*(char **)((long)segmentParam + 0x10) <= address)) &&
     ((ulong)(uint)((int)address - (int)*(char **)((long)segmentParam + 0x10)) <=
      (*(long *)((long)segmentParam + 0x18) - pageCount) * 0x1000)) {
    pVVar2 = (this->
             super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             ).processHandle;
    pVVar8 = GetCurrentProcess();
    if (pVVar2 != pVVar8) {
      return 1;
    }
    SVar9 = VirtualQuery(address,(PMEMORY_BASIC_INFORMATION)local_70,0x30);
    if (((SVar9 != 0) && (dwSize = pageCount << 0xc, dwSize <= (ulong)memBasicInfo._16_8_)) &&
       (memBasicInfo.RegionSize._4_4_ == desiredOldProtectFlag)) {
      bVar4 = Js::ConfigFlagsTable::IsEnabled
                        ((this->
                         super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                         ).pageAllocatorFlagTable,TraceProtectPagesFlag);
      if (bVar4) {
        Output::Print(L"VirtualProtect(0x%p, %d, %d, %d)\n",address,pageCount,dwSize,
                      (ulong)dwVirtualProtectFlags);
      }
      BVar5 = VirtualProtect(address,dwSize,dwVirtualProtectFlags,(PDWORD)&memBasicInfo.field_0x2c);
      if (BVar5 == 0) {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return 0;
      }
      if (memBasicInfo._44_4_ == desiredOldProtectFlag) {
        return BVar5;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa8a,"(oldProtect == desiredOldProtectFlag)",
                         "oldProtect == desiredOldProtectFlag");
      if (bVar4) {
        *puVar1 = 0;
        return BVar5;
      }
LAB_00256fdc:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  return 0;
}

Assistant:

BOOL
HeapPageAllocator<T>::ProtectPages(__in char* address, size_t pageCount, __in void* segmentParam, DWORD dwVirtualProtectFlags, DWORD desiredOldProtectFlag)
{
    SegmentBase<T> * segment = (SegmentBase<T>*)segmentParam;
#if DBG
    Assert(address >= segment->GetAddress());
    Assert(((uint)(((char *)address) - segment->GetAddress()) <= (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize));

    if (this->IsPageSegment(segment))
    {
        PageSegmentBase<T> * pageSegment = static_cast<PageSegmentBase<T>*>(segment);
        AssertMsg(pageCount <= MAXUINT32, "PageSegment should always be smaller than 4G pages");
        Assert(!pageSegment->IsFreeOrDecommitted(address, static_cast<uint>(pageCount)));
    }
#endif

    // check address alignment, and that the address is in correct range
    if (((uintptr_t)address & (AutoSystemInfo::PageSize - 1)) != 0
        || address < segment->GetAddress()
        || ((uint)(((char *)address) - segment->GetAddress()) > (segment->GetPageCount() - pageCount) * AutoSystemInfo::PageSize))
    {
        // OOPJIT TODO: don't bring down the whole JIT process
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return FALSE;
    }


    // OOP JIT page protection is immutable
    if (this->processHandle != GetCurrentProcess())
    {
        return TRUE;
    }
    MEMORY_BASIC_INFORMATION memBasicInfo;

    // check old protection on all pages about to change, ensure the fidelity
    size_t bytes = VirtualQuery(address, &memBasicInfo, sizeof(memBasicInfo));
    if (bytes == 0)
    {
        MemoryOperationLastError::RecordLastError();
    }
    if (bytes == 0
        || memBasicInfo.RegionSize < pageCount * AutoSystemInfo::PageSize
        || desiredOldProtectFlag != memBasicInfo.Protect)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return FALSE;
    }

    /*Verify if we always pass the PAGE_TARGETS_NO_UPDATE flag, if the protect flag is EXECUTE*/
#if defined(_CONTROL_FLOW_GUARD)
    if (GlobalSecurityPolicy::IsCFGEnabled() &&
        (dwVirtualProtectFlags & (PAGE_EXECUTE | PAGE_EXECUTE_READ | PAGE_EXECUTE_READWRITE)) &&
        ((dwVirtualProtectFlags & PAGE_TARGETS_NO_UPDATE) == 0))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return FALSE;
    }
#endif

#if defined(ENABLE_JIT_CLAMP)
    bool makeExecutable = (dwVirtualProtectFlags & (PAGE_EXECUTE | PAGE_EXECUTE_READ | PAGE_EXECUTE_READWRITE)) ? true : false;

    AutoEnableDynamicCodeGen enableCodeGen(makeExecutable);
#endif

#if DBG_DUMP || defined(RECYCLER_TRACE)
    if (this->pageAllocatorFlagTable.IsEnabled(Js::TraceProtectPagesFlag))
    {
        Output::Print(_u("VirtualProtect(0x%p, %d, %d, %d)\n"), address, pageCount, pageCount * AutoSystemInfo::PageSize, dwVirtualProtectFlags);
    }
#endif

    DWORD oldProtect; // this is only for first page
    BOOL retVal = VirtualProtect(address, pageCount * AutoSystemInfo::PageSize, dwVirtualProtectFlags, &oldProtect);
    if (retVal == FALSE)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
    }
    else
    {
        Assert(oldProtect == desiredOldProtectFlag);
    }

    return retVal;
}